

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O0

FEvent * __thiscall FEventTree::Successor(FEventTree *this,FEvent *event)

{
  bool bVar1;
  FEventTree *local_28;
  FEvent *y;
  FEvent *event_local;
  FEventTree *this_local;
  
  if ((FEventTree *)event->Right == this) {
    local_28 = (FEventTree *)event->Parent;
    y = event;
    while( true ) {
      bVar1 = false;
      if (local_28 != this) {
        bVar1 = y == (local_28->Nil).Right;
      }
      if (!bVar1) break;
      y = &local_28->Nil;
      local_28 = (FEventTree *)(local_28->Nil).Parent;
    }
    this_local = local_28;
  }
  else {
    for (y = event->Right; (FEventTree *)y->Left != this; y = y->Left) {
    }
    this_local = (FEventTree *)y;
  }
  return &this_local->Nil;
}

Assistant:

FEvent *FEventTree::Successor (FEvent *event) const
{
	if (event->Right != &Nil)
	{
		event = event->Right;
		while (event->Left != &Nil)
		{
			event = event->Left;
		}
		return event;
	}
	else
	{
		FEvent *y = event->Parent;
		while (y != &Nil && event == y->Right)
		{
			event = y;
			y = y->Parent;
		}
		return y;
	}
}